

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str)

{
  initializer_list<char> __l;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  iterator iVar4;
  iterator iVar5;
  allocator<char> local_1b9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  string local_1a8 [39];
  allocator<char> local_181;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined1 local_170 [8];
  string value;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  string local_108 [32];
  value_type local_e8;
  long local_c8;
  size_type end_1;
  string local_a0 [32];
  value_type local_80;
  long local_60;
  size_type end;
  anon_class_1_0_00000001_for__M_pred find_ws;
  allocator_type local_43;
  char local_42 [2];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> delims;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  
  local_42[0] = '\'';
  local_42[1] = 0x22;
  local_40 = local_42;
  local_38 = 2;
  delims.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = str;
  ::std::allocator<char>::allocator();
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_30,__l,&local_43);
  ::std::allocator<char>::~allocator(&local_43);
  trim(str);
  end._2_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  while (bVar1 = ::std::__cxx11::string::empty(), ((bVar1 ^ 0xff) & 1) != 0) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
    if (*pcVar3 == '\'') {
      local_60 = ::std::__cxx11::string::find((char)str,0x27);
      if (local_60 == -1) {
        ::std::__cxx11::string::substr((ulong)&end_1,(ulong)str);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&end_1);
        ::std::__cxx11::string::~string((string *)&end_1);
        ::std::__cxx11::string::operator=((string *)str,"");
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_80,(ulong)str);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_80);
        ::std::__cxx11::string::~string((string *)&local_80);
        ::std::__cxx11::string::substr((ulong)local_a0,(ulong)str);
        ::std::__cxx11::string::operator=((string *)str,local_a0);
        ::std::__cxx11::string::~string(local_a0);
      }
    }
    else {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
      if (*pcVar3 == '\"') {
        local_c8 = ::std::__cxx11::string::find((char)str,0x22);
        if (local_c8 == -1) {
          ::std::__cxx11::string::substr((ulong)&it,(ulong)str);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&it);
          ::std::__cxx11::string::~string((string *)&it);
          ::std::__cxx11::string::operator=((string *)str,"");
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_e8,(ulong)str);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_e8);
          ::std::__cxx11::string::~string((string *)&local_e8);
          ::std::__cxx11::string::substr((ulong)local_108,(ulong)str);
          ::std::__cxx11::string::operator=((string *)str,local_108);
          ::std::__cxx11::string::~string(local_108);
        }
      }
      else {
        iVar4 = ::std::begin<std::__cxx11::string>(str);
        iVar5 = ::std::end<std::__cxx11::string>(str);
        local_130 = ::std::
                    find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::split_up(std::__cxx11::string)::_lambda(char)_1_>
                              (iVar4._M_current,iVar5._M_current);
        value.field_2._8_8_ = ::std::end<std::__cxx11::string>(str);
        bVar2 = __gnu_cxx::operator!=
                          (&local_130,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&value.field_2 + 8));
        if (bVar2) {
          local_178._M_current = (char *)::std::__cxx11::string::begin();
          local_180._M_current = local_130._M_current;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((string *)local_170,local_178,local_180,&local_181);
          ::std::allocator<char>::~allocator(&local_181);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)local_170);
          local_1b0._M_current = local_130._M_current;
          local_1b8._M_current = (char *)::std::__cxx11::string::end();
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    (local_1a8,local_1b0,local_1b8,&local_1b9);
          ::std::__cxx11::string::operator=((string *)str,local_1a8);
          ::std::__cxx11::string::~string(local_1a8);
          ::std::allocator<char>::~allocator(&local_1b9);
          ::std::__cxx11::string::~string((string *)local_170);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,str);
          ::std::__cxx11::string::operator=((string *)str,"");
        }
      }
    }
    trim(str);
  }
  end._2_1_ = 1;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_up(std::string str) {

    std::vector<char> delims = {'\'', '\"'};
    auto find_ws = [](char ch) { return std::isspace<char>(ch, std::locale()); };
    trim(str);

    std::vector<std::string> output;

    while(!str.empty()) {
        if(str[0] == '\'') {
            auto end = str.find('\'', 1);
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else if(str[0] == '\"') {
            auto end = str.find('\"', 1);
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }

        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        trim(str);
    }

    return output;
}